

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::setStateWeight(L2NormCost *this,MatrixDynSize *stateWeights)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long in_RDI;
  MatrixDynSize *in_stack_00000270;
  CostAttributes *in_stack_00000278;
  bool local_1;
  
  lVar2 = iDynTree::MatrixDynSize::rows();
  lVar3 = iDynTree::MatrixDynSize::cols();
  if (lVar2 == lVar3) {
    bVar1 = CostAttributes::isValid(*(CostAttributes **)(in_RDI + 0x28));
    if (bVar1) {
      bVar1 = CostAttributes::setWeightMatrix(in_stack_00000278,in_stack_00000270);
      if (bVar1) {
        local_1 = true;
      }
      else {
        iDynTree::reportError
                  ("L2NormCost","setStateWeight","Error when specifying the state weights.");
        local_1 = false;
      }
    }
    else {
      iDynTree::reportError
                ("L2NormCost","setStateWeight",
                 "The state cost portion has been deactivated, given the provided selectors.");
      local_1 = false;
    }
  }
  else {
    iDynTree::reportError
              ("L2NormCost","setStateWeight","The stateWeights matrix is supposed to be squared.");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool L2NormCost::setStateWeight(const MatrixDynSize &stateWeights)
        {
            if (stateWeights.rows() != stateWeights.cols()) {
                reportError("L2NormCost", "setStateWeight", "The stateWeights matrix is supposed to be squared.");
                return false;
            }

            if (!(m_pimpl->stateCost.isValid())) {
                reportError("L2NormCost", "setStateWeight", "The state cost portion has been deactivated, given the provided selectors.");
                return false;
            }

            if (!(m_pimpl->stateCost.setWeightMatrix(stateWeights))) {
                reportError("L2NormCost", "setStateWeight", "Error when specifying the state weights.");
                return false;
            }

            return true;
        }